

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O2

int cubeb_strings_init(cubeb_strings **strings)

{
  cubeb_strings *pcVar1;
  int iVar2;
  
  iVar2 = -1;
  if (strings != (cubeb_strings **)0x0) {
    pcVar1 = (cubeb_strings *)calloc(1,0x30);
    if (pcVar1 != (cubeb_strings *)0x0) {
      pcVar1->size = 4;
      pcVar1->data = pcVar1->small_store;
      *strings = pcVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
cubeb_strings_init(cubeb_strings ** strings)
{
  cubeb_strings * strs = NULL;

  if (!strings) {
    return CUBEB_ERROR;
  }

  strs = calloc(1, sizeof(cubeb_strings));
  assert(strs);

  if (!strs) {
    return CUBEB_ERROR;
  }

  strs->size = sizeof(strs->small_store) / sizeof(strs->small_store[0]);
  strs->count = 0;
  strs->data = strs->small_store;

  *strings = strs;

  return CUBEB_OK;
}